

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::append_column
          (compressed_sparse_matrix<filtration_entry_t> *this)

{
  deque<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  value_type_conflict3 *in_RDI;
  
  this_00 = (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
            std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::size
                      ((deque<filtration_entry_t,_std::allocator<filtration_entry_t>_> *)0x1cb5fb);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,in_RDI);
  return;
}

Assistant:

void append_column() { bounds.push_back(entries.size()); }